

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O1

int run_array_container_andnot(run_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int iVar2;
  rle16_t *prVar3;
  ushort *puVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  rle16_t *prVar7;
  bool bVar8;
  uint uVar9;
  _Bool _Var10;
  int iVar11;
  uint uVar12;
  undefined8 in_RAX;
  run_container_t *prVar13;
  array_container_t *paVar14;
  bitset_container_t *src_1_00;
  run_container_t *prVar15;
  ushort uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  int32_t iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  uint8_t return_type;
  byte local_31;
  
  local_31 = (byte)((ulong)in_RAX >> 0x38);
  iVar11 = run_container_cardinality(src_1);
  if (iVar11 < 0x21) {
    if (src_2->cardinality == 0) {
      prVar13 = run_container_clone(src_1);
      *dst = prVar13;
      uVar12 = 3;
    }
    else {
      prVar13 = run_container_create_given_capacity(src_2->cardinality + iVar11);
      bVar8 = 0 < src_1->n_runs;
      if (0 < src_1->n_runs) {
        prVar3 = src_1->runs;
        uVar12 = (uint)prVar3->value;
        uVar17 = (uint)prVar3->length + (uint)prVar3->value + 1;
        iVar11 = src_2->cardinality;
        if (iVar11 < 1) {
          uVar23 = 0;
        }
        else {
          puVar4 = src_2->array;
          uVar20 = (uint)*puVar4;
          iVar18 = 0;
          uVar23 = 0;
          do {
            uVar16 = (ushort)uVar12;
            uVar9 = uVar12;
            if (uVar20 < uVar17) {
              if (uVar20 < uVar12) {
                iVar18 = iVar18 + 1;
                if (iVar18 < iVar11) {
                  uVar20 = (uint)puVar4[iVar18];
                }
              }
              else {
                if (uVar12 < uVar20) {
                  prVar7 = prVar13->runs;
                  iVar2 = prVar13->n_runs;
                  prVar13->n_runs = iVar2 + 1;
                  prVar7[iVar2].value = uVar16;
                  prVar7[iVar2].length = ~uVar16 + (short)uVar20;
                }
                uVar9 = uVar20 + 1;
                if (uVar17 <= uVar20 + 1) goto LAB_0011f22f;
              }
            }
            else {
              prVar7 = prVar13->runs;
              iVar2 = prVar13->n_runs;
              prVar13->n_runs = iVar2 + 1;
              prVar7[iVar2].value = uVar16;
              prVar7[iVar2].length = ~uVar16 + (short)uVar17;
LAB_0011f22f:
              uVar23 = uVar23 + 1;
              uVar9 = uVar12;
              if ((int)uVar23 < src_1->n_runs) {
                uVar17 = (uint)prVar3[(int)uVar23].length + (uint)prVar3[(int)uVar23].value + 1;
                uVar9 = (uint)prVar3[(int)uVar23].value;
              }
            }
            uVar12 = uVar9;
            bVar8 = (int)uVar23 < src_1->n_runs;
            if (src_1->n_runs <= (int)uVar23) goto LAB_0011f4eb;
          } while (iVar18 < iVar11);
        }
        if (bVar8) {
          prVar7 = prVar13->runs;
          lVar19 = (long)prVar13->n_runs;
          prVar13->n_runs = (int32_t)(lVar19 + 1);
          prVar7[lVar19].value = (ushort)uVar12;
          prVar7[lVar19].length = (short)uVar17 + ~(ushort)uVar12;
          iVar11 = uVar23 + 1;
          iVar18 = src_1->n_runs - iVar11;
          if (iVar18 != 0 && iVar11 <= src_1->n_runs) {
            memcpy(prVar7 + lVar19 + 1,prVar3 + iVar11,(long)iVar18 << 2);
            prVar13->n_runs = prVar13->n_runs + ~uVar23 + src_1->n_runs;
          }
        }
      }
LAB_0011f4eb:
      prVar15 = (run_container_t *)convert_run_to_efficient_container(prVar13,&local_31);
      *dst = prVar15;
      if (prVar13 != prVar15) {
        run_container_free(prVar13);
      }
      uVar12 = (uint)local_31;
    }
  }
  else if (iVar11 < 0x1001) {
    paVar14 = array_container_create_given_capacity(iVar11);
    iVar11 = src_1->n_runs;
    if ((long)iVar11 < 1) {
      iVar21 = 0;
    }
    else {
      prVar3 = src_1->runs;
      puVar5 = src_2->array;
      iVar2 = src_2->cardinality;
      iVar18 = -1;
      lVar19 = 0;
      iVar21 = 0;
      do {
        uVar16 = prVar3[lVar19].value;
        uVar12 = (uint)uVar16;
        iVar24 = iVar18 + 1;
        iVar27 = iVar24;
        if ((iVar24 < iVar2) && (puVar5[iVar24] < uVar16)) {
          iVar18 = iVar18 + 2;
          iVar26 = 0;
          iVar22 = iVar2 + -1;
          if (iVar18 < iVar2) {
            iVar27 = 1;
            do {
              iVar22 = iVar18;
              iVar26 = iVar27;
              if (uVar16 <= puVar5[iVar18]) break;
              iVar26 = iVar27 * 2;
              iVar18 = iVar24 + iVar27 * 2;
              iVar22 = iVar2 + -1;
              iVar27 = iVar26;
            } while (iVar18 < iVar2);
            iVar26 = iVar26 >> 1;
          }
          iVar27 = iVar22;
          if (((puVar5[iVar22] != uVar16) && (iVar27 = iVar2, uVar16 <= puVar5[iVar22])) &&
             (iVar27 = iVar22, iVar26 + iVar24 + 1 != iVar22)) {
            iVar26 = iVar26 + iVar24;
            do {
              iVar27 = iVar26 + iVar22 >> 1;
              if (puVar5[iVar27] == uVar16) break;
              iVar18 = iVar27;
              if (puVar5[iVar27] < uVar16) {
                iVar18 = iVar22;
                iVar26 = iVar27;
              }
              iVar27 = iVar18;
              iVar22 = iVar18;
            } while (iVar26 + 1 != iVar18);
          }
        }
        iVar18 = iVar27;
        uVar1 = prVar3[lVar19].length;
        if (iVar18 < iVar2) {
          uVar17 = (uint)puVar5[iVar18];
          if ((uint)uVar1 + (uint)uVar16 < (uint)puVar5[iVar18]) {
            puVar6 = paVar14->array;
            lVar25 = 0;
            do {
              puVar6[iVar21 + lVar25] = uVar16 + (short)lVar25;
              lVar25 = lVar25 + 1;
            } while (uVar1 + 1 != (int)lVar25);
            iVar21 = iVar21 + (int)lVar25;
          }
          else {
            iVar27 = uVar1 + 1;
            do {
              if (uVar12 == uVar17) {
                iVar24 = iVar18 + 1;
                if (iVar24 < iVar2) {
                  uVar17 = (uint)puVar5[iVar24];
                  iVar18 = iVar24;
                }
                else {
                  uVar17 = 0;
                }
              }
              else {
                lVar25 = (long)iVar21;
                iVar21 = iVar21 + 1;
                paVar14->array[lVar25] = (uint16_t)uVar12;
              }
              uVar12 = uVar12 + 1;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          iVar18 = iVar18 + -1;
        }
        else {
          puVar6 = paVar14->array;
          lVar25 = 0;
          do {
            puVar6[iVar21 + lVar25] = uVar16 + (short)lVar25;
            lVar25 = lVar25 + 1;
          } while (uVar1 + 1 != (int)lVar25);
          iVar21 = iVar21 + (int)lVar25;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != iVar11);
    }
    paVar14->cardinality = iVar21;
    *dst = paVar14;
    uVar12 = 2;
  }
  else {
    src_1_00 = bitset_container_from_run(src_1);
    _Var10 = bitset_array_container_iandnot(src_1_00,src_2,dst);
    uVar12 = 2 - _Var10;
  }
  return uVar12;
}

Assistant:

int run_array_container_andnot(const run_container_t *src_1,
                               const array_container_t *src_2,
                               container_t **dst) {
    // follows the Java impl as of June 2016

    int card = run_container_cardinality(src_1);
    const int arbitrary_threshold = 32;

    if (card <= arbitrary_threshold) {
        if (src_2->cardinality == 0) {
            *dst = run_container_clone(src_1);
            return RUN_CONTAINER_TYPE;
        }
        // Java's "lazyandNot.toEfficientContainer" thing
        run_container_t *answer = run_container_create_given_capacity(
            card + array_container_cardinality(src_2));

        int rlepos = 0;
        int xrlepos = 0;  // "x" is src_2
        rle16_t rle = src_1->runs[rlepos];
        int32_t start = rle.value;
        int32_t end = start + rle.length + 1;
        int32_t xstart = src_2->array[xrlepos];

        while ((rlepos < src_1->n_runs) && (xrlepos < src_2->cardinality)) {
            if (end <= xstart) {
                // output the first run
                answer->runs[answer->n_runs++] =
                    CROARING_MAKE_RLE16(start, end - start - 1);
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
            } else if (xstart + 1 <= start) {
                // exit the second run
                xrlepos++;
                if (xrlepos < src_2->cardinality) {
                    xstart = src_2->array[xrlepos];
                }
            } else {
                if (start < xstart) {
                    answer->runs[answer->n_runs++] =
                        CROARING_MAKE_RLE16(start, xstart - start - 1);
                }
                if (xstart + 1 < end) {
                    start = xstart + 1;
                } else {
                    rlepos++;
                    if (rlepos < src_1->n_runs) {
                        start = src_1->runs[rlepos].value;
                        end = start + src_1->runs[rlepos].length + 1;
                    }
                }
            }
        }
        if (rlepos < src_1->n_runs) {
            answer->runs[answer->n_runs++] =
                CROARING_MAKE_RLE16(start, end - start - 1);
            rlepos++;
            if (rlepos < src_1->n_runs) {
                memcpy(answer->runs + answer->n_runs, src_1->runs + rlepos,
                       (src_1->n_runs - rlepos) * sizeof(rle16_t));
                answer->n_runs += (src_1->n_runs - rlepos);
            }
        }
        uint8_t return_type;
        *dst = convert_run_to_efficient_container(answer, &return_type);
        if (answer != *dst) run_container_free(answer);
        return return_type;
    }
    // else it's a bitmap or array

    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *ac = array_container_create_given_capacity(card);
        // nb Java code used a generic iterator-based merge to compute
        // difference
        ac->cardinality = run_array_array_subtract(src_1, src_2, ac);
        *dst = ac;
        return ARRAY_CONTAINER_TYPE;
    }
    bitset_container_t *ans = bitset_container_from_run(src_1);
    bool result_is_bitset = bitset_array_container_iandnot(ans, src_2, dst);
    return (result_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);
}